

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O0

void DoVerticalFilter_C(uint8_t *in,int width,int height,int stride,uint8_t *out)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int row;
  uint8_t *preds;
  int local_2c;
  uint8_t *local_28;
  uint8_t *local_20;
  uint8_t *local_8;
  
  *in_R8 = *in_RDI;
  PredictLine_C(in_RDI + 1,in_RDI,in_R8 + 1,in_ESI + -1);
  local_8 = in_RDI + in_ECX;
  local_20 = in_R8 + in_ECX;
  local_28 = in_RDI;
  for (local_2c = 1; local_2c < in_EDX; local_2c = local_2c + 1) {
    PredictLine_C(local_8,local_28,local_20,in_ESI);
    local_28 = local_28 + in_ECX;
    local_8 = local_8 + in_ECX;
    local_20 = local_20 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_C(const uint8_t* WEBP_RESTRICT in,
                                           int width, int height, int stride,
                                           uint8_t* WEBP_RESTRICT out) {
  const uint8_t* preds = in;
  int row;
  DCHECK(in, out);

  // Very first top-left pixel is copied.
  out[0] = in[0];
  // Rest of top scan-line is left-predicted.
  PredictLine_C(in + 1, preds, out + 1, width - 1);
  in += stride;
  out += stride;

  // Filter line-by-line.
  for (row = 1; row < height; ++row) {
    PredictLine_C(in, preds, out, width);
    preds += stride;
    in += stride;
    out += stride;
  }
}